

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckIndent.cxx
# Opt level: O2

bool __thiscall kws::Parser::InitIndentation(Parser *this)

{
  string *psVar1;
  pointer pcVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  char cVar9;
  byte bVar10;
  vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_> *this_00;
  string *buffer;
  pointer __x;
  pointer puVar11;
  ulong uVar12;
  int iVar13;
  size_t *psVar14;
  IndentPosition ind;
  allocator local_269;
  ulong local_268;
  ulong local_260;
  size_t posNamespaceComments;
  int local_250;
  int local_24c;
  string local_248;
  IndentPosition tempind;
  vector<unsigned_long,_std::allocator<unsigned_long>_> namespacePos;
  vector<unsigned_long,_std::allocator<unsigned_long>_> namespacevec;
  IndentPosition tempind_1;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = &this->m_IdentPositionVector;
  std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::clear(this_00)
  ;
  namespacevec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  namespacevec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  namespacevec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar1 = &this->m_BufferNoComment;
  lVar4 = std::__cxx11::string::find((char *)psVar1,0x162519);
  while (lVar4 != -1) {
    uVar5 = std::__cxx11::string::find((char *)psVar1,0x154cbe);
    if ((uVar5 != 0xffffffffffffffff) &&
       (uVar6 = std::__cxx11::string::find((char *)psVar1,0x161d46), uVar5 < uVar6)) {
      ind.position = GetPositionWithComments(this,uVar5);
      ind.name._M_dataplus._M_p = (pointer)&ind.name.field_2;
      ind.name._M_string_length = 0;
      ind.name.field_2._M_local_buf[0] = '\0';
      ind.current = 0;
      ind.after = 0;
      posNamespaceComments = ind.position;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&namespacevec,&posNamespaceComments);
      std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
                (this_00,&ind);
      sVar7 = posNamespaceComments;
      std::__cxx11::string::string((string *)&local_50,"",(allocator *)&tempind);
      ind.position = FindClosingChar(this,'{','}',sVar7,false,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&namespacevec,&ind.position);
      std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
                (this_00,&ind);
      std::__cxx11::string::~string((string *)&ind.name);
    }
    lVar4 = std::__cxx11::string::find((char *)psVar1,0x162519);
  }
  namespacePos.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  namespacePos.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  namespacePos.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (__x = (this->m_IdentPositionVector).
             super__Vector_base<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>
             ._M_impl.super__Vector_impl_data._M_start;
      __x != (this->m_IdentPositionVector).
             super__Vector_base<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>
             ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&namespacePos,&__x->position);
  }
  do {
    cVar9 = (char)psVar1;
    uVar5 = std::__cxx11::string::find(cVar9,0x7b);
    if (uVar5 == 0xffffffffffffffff) break;
    sVar7 = GetPositionWithComments(this,uVar5);
    bVar3 = IsInElseForbiddenSection(this,sVar7);
  } while (bVar3);
  do {
    if (uVar5 == 0xffffffffffffffff) {
      lVar4 = std::__cxx11::string::find((char *)psVar1,0x162523);
      do {
        if (lVar4 == -1) {
          uVar5 = std::__cxx11::string::find((char *)psVar1,0x162528);
          do {
            while( true ) {
              if (uVar5 == 0xffffffffffffffff) {
                AddIndent(this,"public:",-1,0);
                AddIndent(this,"private:",-1,0);
                AddIndent(this,"protected:",-1,0);
                AddIndent(this,"signals:",-1,0);
                AddIndent(this,"public slots:",-1,0);
                AddIndent(this,"private slots:",-1,0);
                AddIndent(this,"protected slots:",-1,0);
                AddIndent(this,"#include",-99999,0);
                AddIndent(this,"#if",-99999,0);
                AddIndent(this,"#elif",-99999,0);
                AddIndent(this,"#else",-99999,0);
                AddIndent(this,"#endif",-99999,0);
                AddIndent(this,"#define",-99999,0);
                AddIndent(this,"#undef",-99999,0);
                std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                          (&namespacePos.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
                std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                          (&namespacevec.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
                return true;
              }
              bVar3 = CheckValidSwitchStatement(this,(uint)uVar5);
              if (bVar3) break;
              uVar5 = std::__cxx11::string::find((char *)psVar1,0x162528);
            }
            sVar7 = std::__cxx11::string::find((char *)psVar1,0x154cbe);
            std::__cxx11::string::string((string *)&local_190,"",(allocator *)&ind);
            sVar8 = FindClosingChar(this,'{','}',sVar7,true,&local_190);
            std::__cxx11::string::~string((string *)&local_190);
            ind.position = GetPositionWithComments(this,sVar8);
            ind.name._M_dataplus._M_p = (pointer)&ind.name.field_2;
            ind.name._M_string_length = 0;
            ind.name.field_2._M_local_buf[0] = '\0';
            ind.current = -1;
            ind.after = -2;
            std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
            push_back(this_00,&ind);
            uVar6 = std::__cxx11::string::find((char *)psVar1,0x16252f);
            local_268 = uVar5;
            local_260 = sVar8;
            if (sVar8 < uVar6) {
              uVar6 = 0xffffffffffffffff;
            }
            while (uVar5 = std::__cxx11::string::find((char *)psVar1,0x162528),
                  uVar5 != 0xffffffffffffffff) {
              bVar3 = CheckValidSwitchStatement(this,(uint)uVar5);
              if (bVar3) {
                if (uVar6 <= uVar5) goto LAB_00140c6a;
                uVar6 = std::__cxx11::string::find((char *)psVar1,0x16252f);
              }
            }
            if (uVar6 != 0xffffffffffffffff) {
LAB_00140c6a:
              posNamespaceComments = GetPositionWithComments(this,uVar6);
              local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
              local_248._M_string_length = 0;
              local_248.field_2._M_local_buf[0] = '\0';
              do {
                uVar5 = uVar6;
                if ((uVar5 == 0) ||
                   (uVar12 = (ulong)(byte)(psVar1->_M_dataplus)._M_p[uVar5 - 1], 0x20 < uVar12))
                break;
                uVar6 = uVar5 - 1;
              } while ((0x100002400U >> (uVar12 & 0x3f) & 1) != 0);
              local_250 = -(uint)(sVar7 + 1 != uVar5);
              local_24c = 0;
              std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
              push_back(this_00,(value_type *)&posNamespaceComments);
              sVar8 = std::__cxx11::string::find((char *)psVar1,0x162e43);
              sVar8 = GetPositionWithComments(this,sVar8);
              pcVar2 = (this->m_Buffer)._M_dataplus._M_p;
              uVar5 = (this->m_Buffer)._M_string_length;
              uVar12 = sVar8 + 1;
              uVar6 = uVar12;
              if (uVar12 < uVar5) {
                uVar6 = uVar5;
              }
              for (; uVar12 < uVar5; uVar12 = uVar12 + 1) {
                bVar10 = pcVar2[uVar12];
                if ((0x20 < (ulong)bVar10) || ((0x100002400U >> ((ulong)bVar10 & 0x3f) & 1) == 0))
                goto LAB_00140d58;
              }
              bVar10 = pcVar2[uVar6];
              uVar12 = uVar6;
LAB_00140d58:
              if (bVar10 == 0x7b) {
                tempind.name._M_dataplus._M_p = (pointer)&tempind.name.field_2;
                tempind.name._M_string_length = 0;
                tempind.name.field_2._M_local_buf[0] = '\0';
                tempind.current = 0;
                tempind.after = 0;
                tempind.position = uVar12;
                std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
                push_back(this_00,&tempind);
                std::__cxx11::string::string((string *)&local_130,"",(allocator *)&tempind_1);
                tempind.position = FindClosingChar(this,'{','}',uVar12,false,&local_130);
                std::__cxx11::string::~string((string *)&local_130);
                tempind.current = 0;
                tempind.after = 0;
                std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
                push_back(this_00,&tempind);
                std::__cxx11::string::~string((string *)&tempind.name);
              }
              std::__cxx11::string::~string((string *)&local_248);
            }
            iVar13 = 1;
            while (uVar5 = std::__cxx11::string::find((char *)psVar1,0x162537), uVar5 < local_260) {
              uVar6 = std::__cxx11::string::find((char *)psVar1,0x162528);
              if ((sVar7 < uVar6) && (uVar6 < uVar5)) {
                sVar8 = std::__cxx11::string::find((char *)psVar1,0x154cbe);
                buffer = &local_150;
                std::__cxx11::string::string((string *)buffer,"",(allocator *)&posNamespaceComments)
                ;
                FindClosingChar(this,'{','}',sVar8,true,buffer);
              }
              else {
                posNamespaceComments = GetPositionWithComments(this,uVar5);
                local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
                local_248._M_string_length = 0;
                local_248.field_2._M_local_buf[0] = '\0';
                local_24c = 0;
                local_250 = iVar13 + -1;
                std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
                push_back(this_00,(value_type *)&posNamespaceComments);
                do {
                  sVar8 = std::__cxx11::string::find(cVar9,0x3a);
                  if ((this->m_BufferNoComment)._M_string_length <= sVar8 + 1) break;
                } while ((psVar1->_M_dataplus)._M_p[sVar8 + 1] == ':');
                if (sVar8 != 0xffffffffffffffff) {
                  sVar8 = GetPositionWithComments(this,sVar8);
                  tempind.name._M_dataplus._M_p = (pointer)&tempind.name.field_2;
                  tempind.name._M_string_length = 0;
                  tempind.name.field_2._M_local_buf[0] = '\0';
                  tempind.after = iVar13;
                  tempind.current = iVar13 + -1;
                  tempind.position = sVar8;
                  std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>
                  ::push_back(this_00,&tempind);
                  pcVar2 = (this->m_Buffer)._M_dataplus._M_p;
                  uVar5 = (this->m_Buffer)._M_string_length;
                  uVar12 = sVar8 + 1;
                  uVar6 = uVar12;
                  if (uVar12 < uVar5) {
                    uVar6 = uVar5;
                  }
                  for (; uVar12 < uVar5; uVar12 = uVar12 + 1) {
                    bVar10 = pcVar2[uVar12];
                    if ((0x20 < (ulong)bVar10) ||
                       ((0x100002400U >> ((ulong)bVar10 & 0x3f) & 1) == 0)) goto LAB_00140feb;
                  }
                  bVar10 = pcVar2[uVar6];
                  uVar12 = uVar6;
LAB_00140feb:
                  if (bVar10 == 0x7b) {
                    tempind_1.name._M_dataplus._M_p = (pointer)&tempind_1.name.field_2;
                    tempind_1.name._M_string_length = 0;
                    tempind_1.name.field_2._M_local_buf[0] = '\0';
                    tempind_1.current = 0;
                    tempind_1.after = 0;
                    tempind_1.position = uVar12;
                    std::
                    vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
                    push_back(this_00,&tempind_1);
                    std::__cxx11::string::string((string *)&local_170,"",&local_269);
                    tempind_1.position = FindClosingChar(this,'{','}',uVar12,false,&local_170);
                    std::__cxx11::string::~string((string *)&local_170);
                    tempind_1.current = 0;
                    tempind_1.after = 0;
                    std::
                    vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
                    push_back(this_00,&tempind_1);
                    std::__cxx11::string::~string((string *)&tempind_1.name);
                  }
                  std::__cxx11::string::~string((string *)&tempind.name);
                }
                buffer = &local_248;
              }
              std::__cxx11::string::~string((string *)buffer);
              iVar13 = 0;
            }
            uVar5 = std::__cxx11::string::find((char *)psVar1,0x162528);
            std::__cxx11::string::~string((string *)&ind.name);
          } while( true );
        }
        uVar5 = lVar4 + 5;
        pcVar2 = (this->m_BufferNoComment)._M_dataplus._M_p;
        uVar6 = (this->m_BufferNoComment)._M_string_length;
        uVar12 = uVar5;
        if (uVar5 < uVar6) {
          uVar12 = uVar6;
        }
        for (; uVar5 < uVar6; uVar5 = uVar5 + 1) {
          bVar10 = pcVar2[uVar5];
          if ((0x20 < (ulong)bVar10) || ((0x100002400U >> ((ulong)bVar10 & 0x3f) & 1) == 0))
          goto LAB_00140a26;
        }
        bVar10 = pcVar2[uVar12];
LAB_00140a26:
        if ((bVar10 == 0x28) &&
           (sVar7 = std::__cxx11::string::find(cVar9,0x7b), sVar7 != 0xffffffffffffffff)) {
          sVar7 = GetPositionWithComments(this,sVar7);
          ind.name._M_dataplus._M_p = (pointer)&ind.name.field_2;
          ind.name._M_string_length = 0;
          ind.name.field_2._M_local_buf[0] = '\0';
          ind.current = 0;
          ind.after = 1;
          ind.position = sVar7;
          std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
          push_back(this_00,&ind);
          std::__cxx11::string::string((string *)&local_110,"",(allocator *)&posNamespaceComments);
          ind.position = FindClosingChar(this,'{','}',sVar7,false,&local_110);
          std::__cxx11::string::~string((string *)&local_110);
          ind.current = -1;
          ind.after = -1;
          std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
          push_back(this_00,&ind);
          std::__cxx11::string::~string((string *)&ind.name);
        }
        lVar4 = std::__cxx11::string::find((char *)psVar1,0x162523);
      } while( true );
    }
    local_260 = local_260 & 0xffffffff00000000;
    while( true ) {
      uVar6 = std::__cxx11::string::find(cVar9,0x7b);
      if (uVar5 <= uVar6) break;
      sVar7 = GetPositionWithComments(this,uVar6);
      bVar3 = IsInElseForbiddenSection(this,sVar7);
      if (!bVar3) {
        std::__cxx11::string::string((string *)&local_70,"",(allocator *)&ind);
        bVar3 = IsBetweenQuote(this,uVar6,false,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        if (!bVar3) {
          bVar10 = 0;
          for (puVar11 = namespacePos.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
              puVar11 !=
              namespacePos.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_finish; puVar11 = puVar11 + 1) {
            sVar7 = *puVar11;
            sVar8 = GetPositionWithComments(this,uVar6);
            if (sVar7 == sVar8) {
              bVar10 = 1;
            }
          }
          local_260 = CONCAT44(local_260._4_4_,(int)local_260 + (uint)(~bVar10 & 1));
        }
      }
    }
    local_268 = local_268 & 0xffffffff00000000;
    while (uVar6 = std::__cxx11::string::find(cVar9,0x7d), uVar6 < uVar5) {
      sVar7 = GetPositionWithComments(this,uVar6);
      bVar3 = IsInElseForbiddenSection(this,sVar7);
      if (!bVar3) {
        std::__cxx11::string::string((string *)&local_90,"",(allocator *)&ind);
        bVar3 = IsBetweenQuote(this,uVar6,false,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        if (!bVar3) {
          bVar10 = 0;
          for (puVar11 = namespacePos.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
              puVar11 !=
              namespacePos.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_finish; puVar11 = puVar11 + 1) {
            sVar7 = *puVar11;
            sVar8 = GetPositionWithComments(this,uVar6);
            if (sVar7 == sVar8) {
              bVar10 = 1;
            }
          }
          local_268 = CONCAT44(local_268._4_4_,(int)local_268 + (uint)(~bVar10 & 1));
        }
      }
    }
    psVar14 = namespacevec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((int)local_268 == (int)local_260) {
LAB_0014083b:
      if (psVar14 !=
          namespacevec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) break;
      sVar7 = GetPositionWithComments(this,uVar5);
      ind.name._M_dataplus._M_p = (pointer)&ind.name.field_2;
      ind.name._M_string_length = 0;
      ind.name.field_2._M_local_buf[0] = '\0';
      ind.current = 0;
      ind.after = 1;
      ind.position = sVar7;
      std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
                (this_00,&ind);
      std::__cxx11::string::string((string *)&local_b0,"",(allocator *)&posNamespaceComments);
      ind.position = FindClosingChar(this,'{','}',sVar7,false,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      while( true ) {
        sVar7 = ind.position;
        std::__cxx11::string::string((string *)&local_d0,"",(allocator *)&posNamespaceComments);
        bVar3 = IsBetweenQuote(this,sVar7,true,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        sVar7 = ind.position;
        if (!bVar3) break;
        std::__cxx11::string::string((string *)&local_f0,"",(allocator *)&posNamespaceComments);
        ind.position = FindClosingChar(this,'{','}',sVar7 + 1,false,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
      }
      ind.current = -1;
      ind.after = -1;
      std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
                (this_00,&ind);
      std::__cxx11::string::~string((string *)&ind.name);
    }
LAB_0014099d:
    uVar5 = std::__cxx11::string::find(cVar9,0x7b);
  } while( true );
  sVar7 = *psVar14;
  sVar8 = GetPositionWithComments(this,uVar5);
  psVar14 = psVar14 + 1;
  if (sVar7 == sVar8) goto LAB_0014099d;
  goto LAB_0014083b;
}

Assistant:

bool Parser::InitIndentation()
{
  m_IdentPositionVector.clear();

  // namespace
  std::vector<size_t> namespacevec;

  size_t posNamespace = m_BufferNoComment.find("namespace",0);
  while(posNamespace!=std::string::npos)
    {
    size_t posNamespace1 = m_BufferNoComment.find("{",posNamespace);
    if(posNamespace1 != std::string::npos)
      {
      size_t posNamespace2 = m_BufferNoComment.find(";",posNamespace);
      if((posNamespace2 == std::string::npos) || (posNamespace2 > posNamespace1))
        {
        size_t posNamespaceComments = this->GetPositionWithComments(posNamespace1);
        IndentPosition ind;
        ind.position = posNamespaceComments;
        ind.current = 0;
        ind.after = 0;
        namespacevec.push_back(posNamespaceComments);
        //std::cout << "Found Namespace at: " << this->GetLineNumber(posNamespaceComments) << std::endl;
        m_IdentPositionVector.push_back(ind);
        ind.position = this->FindClosingChar('{','}',posNamespaceComments);
        namespacevec.push_back(ind.position);
        m_IdentPositionVector.push_back(ind);
        }
      }
    posNamespace = m_BufferNoComment.find("namespace",posNamespace+1);
    }

  // Create a list of position specific for namespaces
  std::vector<size_t> namespacePos;
  auto itIdentPos = m_IdentPositionVector.begin();
  while(itIdentPos != m_IdentPositionVector.end())
    {
    namespacePos.push_back((*itIdentPos).position);
    itIdentPos++;
    }

  // Check if the { is the first in the file/function or in a namespace
  size_t posClass = m_BufferNoComment.find('{',0);

  while(posClass!= std::string::npos && this->IsInElseForbiddenSection(this->GetPositionWithComments(posClass)))
    {
    posClass = m_BufferNoComment.find('{',posClass+1);
    }

  while(posClass != std::string::npos)
    {
    // We count the number of { and } before posClass
    unsigned int nOpen = 0;
    unsigned int nClose = 0;

    size_t open = m_BufferNoComment.find('{',0);
    while(open!=std::string::npos && open<posClass)
      {
      if(!this->IsInElseForbiddenSection(this->GetPositionWithComments(open))
        && !this->IsBetweenQuote(open)
        )
        {
        bool isNamespace = false;
        // Remove the potential namespaces
        std::vector<size_t>::const_iterator itN = namespacePos.begin();
        while(itN != namespacePos.end())
          {
          if((*itN)==this->GetPositionWithComments(open))
            {
            isNamespace = true;
            }
          itN++;
          }
        if(!isNamespace)
          {
          nOpen++;
          }
        }
      open = m_BufferNoComment.find('{',open+1);
      }

    size_t close = m_BufferNoComment.find('}',0);
    while(close!=std::string::npos && close<posClass)
      {
      if(!this->IsInElseForbiddenSection(this->GetPositionWithComments(close))
        && !this->IsBetweenQuote(close)
        )
        {
        bool isNamespace = false;
        // Remove the potential namespaces
        std::vector<size_t>::const_iterator itN = namespacePos.begin();
        while(itN != namespacePos.end())
          {
          if((*itN)==this->GetPositionWithComments(close))
            {
            isNamespace = true;
            }
          itN++;
          }
        if(!isNamespace)
          {
          nClose++;
          }
        }
      close = m_BufferNoComment.find('}',close+1);
      }

    bool defined = false;

    if(nClose == nOpen)
      {
      // Check if this is not the namespace previously defined
      auto itname = namespacevec.begin();
      while(itname != namespacevec.end())
        {
        if((*itname) == this->GetPositionWithComments(posClass))
          {
          defined = true;
          break;
          }
        itname++;
        }
      }

    if((nClose == nOpen) && !defined)
      {
      // translate the position in the buffer position;
      size_t posClassComments = this->GetPositionWithComments(posClass);
      IndentPosition ind;
      ind.position = posClassComments;
      ind.current = 0;
      ind.after = 1;
      m_IdentPositionVector.push_back(ind);
      ind.position = this->FindClosingChar('{','}',posClassComments);
      while(this->IsBetweenQuote(ind.position,true))
        {
        ind.position = this->FindClosingChar('{','}',ind.position+1);
        }
      ind.current = -1;
      ind.after = -1;
      m_IdentPositionVector.push_back(ind);
      }
    posClass = m_BufferNoComment.find('{',posClass+1);
    }

  // int main()
  size_t posMain = m_BufferNoComment.find("main",0);
  while(posMain != std::string::npos)
    {
    // Check if the next char is '('
    bool valid = true;
    auto pos = static_cast<unsigned long>(posMain + 5);
    while(pos<m_BufferNoComment.size()
         && (m_BufferNoComment[pos]==' '
         || m_BufferNoComment[pos]=='\r'
         || m_BufferNoComment[pos]=='\n')
         )
      {
      pos++;
      }

    if(m_BufferNoComment[pos]!='(')
      {
      valid = false;
      }
    if(valid)
      {
      size_t bracket = m_BufferNoComment.find('{',posMain+4);
      if(bracket != std::string::npos)
        {
        // translate the position in the buffer position;
        size_t posMainComments = this->GetPositionWithComments(bracket);
        IndentPosition ind;
        ind.position = posMainComments;
        ind.current = 0;
        ind.after = 1;
        m_IdentPositionVector.push_back(ind);
        ind.position = this->FindClosingChar('{','}',posMainComments);
        ind.current = -1;
        ind.after = -1;
        m_IdentPositionVector.push_back(ind);
        }
      }
    posMain = m_BufferNoComment.find("main",posMain+4);
    }

  // switch/case statement
  // for the moment break; restore the indentation
  size_t posSwitch = m_BufferNoComment.find("switch",0);
  while(posSwitch != std::string::npos)
    {
    // Check that it is a valid switch statement
    if(!this->CheckValidSwitchStatement(static_cast<unsigned int>(posSwitch)))
     {
     posSwitch = m_BufferNoComment.find("switch",posSwitch+1);
     continue;
     }

    // If this is the first case we find the openning { in order to
    // find the closing } of the switch statement
    size_t openningBracket = m_BufferNoComment.find("{",posSwitch);
    size_t closingBracket = this->FindClosingChar('{','}',openningBracket,true);
    size_t posColumnComments = this->GetPositionWithComments(closingBracket);
    IndentPosition ind;
    ind.position = posColumnComments;
    ind.current = -1;
    ind.after = -2;
    m_IdentPositionVector.push_back(ind);

    // Do the default case
    size_t defaultPos = m_BufferNoComment.find("default",openningBracket);
    if(defaultPos > closingBracket)
      {
      defaultPos = std::string::npos;
      }

    // We need to make sure that there is no "switch" statement nested
    size_t nestedSwitch = m_BufferNoComment.find("switch",posSwitch+1);
    while(nestedSwitch != std::string::npos)
      {
        if(!this->CheckValidSwitchStatement(static_cast<unsigned int>(nestedSwitch)))
        {
        nestedSwitch = m_BufferNoComment.find("switch",nestedSwitch+1);
        continue;
        }

      if(nestedSwitch < defaultPos)
        {
        defaultPos = m_BufferNoComment.find("default",defaultPos+1);
        }
      else
        {
        break;
        }
      nestedSwitch = m_BufferNoComment.find("switch",nestedSwitch+1);
      }

    if(defaultPos != std::string::npos)
      {
      size_t localposColumnComments = this->GetPositionWithComments(defaultPos);
      IndentPosition localind;
      localind.position = localposColumnComments;

      // The current indent should be -1 unless we are right after the openning
      // bracket. In that case the current indent should be 0;
      size_t j=defaultPos-1;
      while(j!=std::string::npos)
        {
        if(m_BufferNoComment[j] != ' '
          && m_BufferNoComment[j] != '\n'
          && m_BufferNoComment[j] != '\r'
          )
          {
          break;
          }
        j--;
        }

      if(j == openningBracket)
        {
        localind.current = 0;
        }
      else
        {
        localind.current = -1;
        }

      localind.after = 0;
      m_IdentPositionVector.push_back(localind);
      // Find the ':' after the default
      size_t column = m_BufferNoComment.find(":",defaultPos+1);
      column = this->GetPositionWithComments(column);

      // Sometimes there is a { right after the : we skip it if this is
      // the case
      size_t ic = column+1;
      while(ic<m_Buffer.size()
            && (m_Buffer[ic] == ' '
            || m_Buffer[ic] == '\r'
            || m_Buffer[ic] == '\n'))
        {
        ic++;
        }
      if(m_Buffer[ic] == '{')
        {
        IndentPosition tempind;
        tempind.position = ic;
        tempind.current = 0;
        tempind.after = 0;
        m_IdentPositionVector.push_back(tempind);
        tempind.position = this->FindClosingChar('{','}',ic);
        tempind.current = 0;
        tempind.after = 0;
        m_IdentPositionVector.push_back(tempind);
        }
      }

    size_t posCase = m_BufferNoComment.find("case",openningBracket);
    bool firstCase = true;
    size_t previousCase = openningBracket;

    while(posCase!= std::string::npos && posCase<closingBracket)
      {
      // Check if we don't have any switch statement inside
      size_t insideSwitch = m_BufferNoComment.find("switch",previousCase);
      if(insideSwitch>openningBracket && insideSwitch<posCase)
        {
        // jump to the end of the inside switch/case
        size_t insideBracket = m_BufferNoComment.find("{",insideSwitch);
        posCase = this->FindClosingChar('{','}',insideBracket,true);
        }
      else
        {
        size_t localposColumnComments = this->GetPositionWithComments(posCase);
        IndentPosition localindtemp;
        localindtemp.position = localposColumnComments;
        if(firstCase)
          {
          localindtemp.current = 0;
          }
        else
          {
          localindtemp.current = -1;
          }
        localindtemp.after = 0;

        m_IdentPositionVector.push_back(localindtemp);

        size_t column = m_BufferNoComment.find(':',posCase+3);
        // Make sure that we are not checing '::'
        while(column+1<m_BufferNoComment.size()
          && m_BufferNoComment[column+1]==':')
          {
          column = m_BufferNoComment.find(':',column+2);
          }

        if(column != std::string::npos)
          {
          // translate the position in the buffer position;
          localposColumnComments = this->GetPositionWithComments(column);
          IndentPosition localind;
          localind.position = localposColumnComments;
          if(firstCase)
            {
            localind.current = 0;
            localind.after = 1;
            }
          else
            {
            localind.current = -1;
            localind.after = 0;
            }
          m_IdentPositionVector.push_back(localind);

          // Sometimes there is a { right after the : we skip it if this is
          // the case
          size_t ic = localposColumnComments+1;
          while(ic<m_Buffer.size()
            && (m_Buffer[ic] == ' '
            || m_Buffer[ic] == '\r'
            || m_Buffer[ic] == '\n'))
            {
            ic++;
            }
          if(m_Buffer[ic] == '{')
            {
            IndentPosition tempind;
            tempind.position = ic;
            tempind.current = 0;
            tempind.after = 0;
            m_IdentPositionVector.push_back(tempind);
            tempind.position = this->FindClosingChar('{','}',ic);
            tempind.current = 0;
            tempind.after = 0;
            m_IdentPositionVector.push_back(tempind);
            }
          }
        }
      firstCase = false;
      previousCase = posCase;
      posCase = m_BufferNoComment.find("case",posCase+1);
      }

    posSwitch = m_BufferNoComment.find("switch",posSwitch+3);
    }

  // Some words should be indented as the previous indent
  this->AddIndent("public:",-1,0);
  this->AddIndent("private:",-1,0);
  this->AddIndent("protected:",-1,0);
  this->AddIndent("signals:",-1,0);
  this->AddIndent("public slots:",-1,0);
  this->AddIndent("private slots:",-1,0);
  this->AddIndent("protected slots:",-1,0);

  // some words should be always align left
  this->AddIndent("#include",ALIGN_LEFT,0);
  this->AddIndent("#if",ALIGN_LEFT,0);
  //this->AddIndent("#ifdef",ALIGN_LEFT,0); // #if is taking care of it
  this->AddIndent("#elif",ALIGN_LEFT,0);
  this->AddIndent("#else",ALIGN_LEFT,0);
  this->AddIndent("#endif",ALIGN_LEFT,0);
  //this->AddIndent("#ifndef",ALIGN_LEFT,0); // #if is taking care of it
  this->AddIndent("#define",ALIGN_LEFT,0);
  this->AddIndent("#undef",ALIGN_LEFT,0);

  return true;
}